

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O0

void __thiscall
LinkageUntangler::select_linear_anchors
          (LinkageUntangler *this,int min_links,int min_transitive_links)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  uint in_EDX;
  undefined8 *in_RDI;
  reference rVar7;
  int in_stack_0000002c;
  sgNodeID_t in_stack_00000030;
  DistanceGraph *in_stack_00000038;
  int i_1;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> bw_sorted;
  int i;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> fw_sorted;
  bool anchor;
  int n;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff44;
  ulong in_stack_ffffffffffffff48;
  DistanceGraph *in_stack_ffffffffffffff50;
  reference local_78;
  int local_64;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_60;
  int local_34;
  byte local_15;
  int local_14;
  uint local_10;
  
  local_14 = 1;
  local_10 = in_EDX;
  do {
    uVar6 = (ulong)local_14;
    sVar3 = std::vector<Node,_std::allocator<Node>_>::size
                      ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40));
    if (sVar3 <= uVar6) {
      return;
    }
    pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[]
                       ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40),
                        (long)local_14);
    if (pvVar4->status != Deleted) {
      local_15 = 1;
      DistanceGraph::fw_neighbours_by_distance
                (in_stack_00000038,in_stack_00000030,in_stack_0000002c);
      sVar3 = std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::size
                        ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                         &stack0xffffffffffffffd0);
      if (1 < sVar3) {
        local_34 = 0;
        while( true ) {
          uVar6 = (ulong)local_34;
          sVar3 = std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::size
                            ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *
                             )&stack0xffffffffffffffd0);
          if (sVar3 - 1 <= uVar6) break;
          in_stack_ffffffffffffff50 = (DistanceGraph *)&stack0xffffffffffffffd0;
          std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::operator[]
                    ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                     in_stack_ffffffffffffff50,(long)local_34);
          std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::operator[]
                    ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                     in_stack_ffffffffffffff50,(long)(local_34 + 1));
          uVar2 = DistanceGraph::link_count
                            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          if (uVar2 < local_10) {
            local_15 = 0;
            break;
          }
          local_34 = local_34 + 1;
        }
      }
      if ((local_15 & 1) != 0) {
        DistanceGraph::fw_neighbours_by_distance
                  (in_stack_00000038,in_stack_00000030,in_stack_0000002c);
        sVar3 = std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::size
                          (&local_60);
        if (1 < sVar3) {
          local_64 = 0;
          while( true ) {
            in_stack_ffffffffffffff48 = (ulong)local_64;
            sVar3 = std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::size
                              (&local_60);
            if (sVar3 - 1 <= in_stack_ffffffffffffff48) break;
            in_stack_ffffffffffffff30 =
                 (vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)*in_RDI;
            pvVar5 = std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::
                     operator[](&local_60,(long)local_64);
            in_stack_ffffffffffffff38 = -pvVar5->second;
            std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::operator[]
                      (&local_60,(long)(local_64 + 1));
            in_stack_ffffffffffffff44 =
                 DistanceGraph::link_count
                           (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            if (in_stack_ffffffffffffff44 < local_10) {
              local_15 = 0;
              break;
            }
            local_64 = local_64 + 1;
          }
        }
        bVar1 = std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::empty
                          (in_stack_ffffffffffffff30);
        if (bVar1) {
          bVar1 = std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::empty
                            (in_stack_ffffffffffffff30);
          if (bVar1) {
            local_15 = 0;
          }
        }
        std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~vector
                  (in_stack_ffffffffffffff30);
      }
      if ((local_15 & 1) != 0) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff38);
        local_78 = rVar7;
        std::_Bit_reference::operator=(&local_78,true);
      }
      std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~vector
                (in_stack_ffffffffffffff30);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void LinkageUntangler::select_linear_anchors(int min_links, int min_transitive_links) {
    for (auto n=1;n<dg.sdg.nodes.size();++n){
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted) continue;
        bool anchor=true;
        auto fw_sorted=dg.fw_neighbours_by_distance(n,min_links);
        if (fw_sorted.size()>1) {
            for (auto i = 0; i < fw_sorted.size() - 1; ++i) {
                if (dg.link_count(-fw_sorted[i].second, fw_sorted[i + 1].second) < min_transitive_links) {
                    anchor = false;
                    break;
                }
            }
        }
        if (anchor) {
            auto bw_sorted = dg.fw_neighbours_by_distance(-n, min_links);
            if (bw_sorted.size()>1) {
                for (auto i = 0; i < bw_sorted.size() - 1; ++i) {
                    if (dg.link_count(-bw_sorted[i].second, bw_sorted[i + 1].second) < min_transitive_links) {
                        anchor = false;
                        break;
                    }
                }
            }
            if (bw_sorted.empty() and fw_sorted.empty()) anchor=false;
        }
        if (anchor) {
                selected_nodes[n] = true;
        }
    }
}